

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::GetDirectBufferPointer
          (EpsCopyOutputStream *this,void **data,int *size,uint8_t **pp)

{
  int iVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint8_t **pp_local;
  int *size_local;
  void **data_local;
  EpsCopyOutputStream *this_local;
  
  if ((this->had_error_ & 1U) == 0) {
    iVar1 = Flush(this,*pp);
    *size = iVar1;
    if ((this->had_error_ & 1U) == 0) {
      *data = this->buffer_end_;
      do {
        if (*size != 0) {
          puVar3 = SetInitialBuffer(this,*data,*size);
          *pp = puVar3;
          return true;
        }
        uVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,data,size);
      } while ((uVar2 & 1) != 0);
      puVar3 = Error(this);
      *pp = puVar3;
    }
    else {
      *pp = this->buffer_;
    }
  }
  else {
    *pp = this->buffer_;
  }
  return false;
}

Assistant:

bool EpsCopyOutputStream::GetDirectBufferPointer(void** data, int* size,
                                                 uint8_t** pp) {
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  *size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  *data = buffer_end_;
  while (*size == 0) {
    if (!stream_->Next(data, size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(*data, *size);
  return true;
}